

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O1

void Lpk_NodeRecordImpact(Lpk_Man_t *p)

{
  uint *puVar1;
  int iVar2;
  uint *puVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int *piVar10;
  ulong uVar11;
  
  iVar2 = p->pObj->Id;
  if (((long)iVar2 < 0) || (p->vVisited->nSize <= iVar2)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
  }
  puVar3 = (uint *)p->vVisited->pArray[iVar2];
  puVar3[1] = 0;
  if (0 < p->nCuts) {
    piVar10 = p->pCuts[0].pLeaves;
    lVar8 = 0;
    do {
      if ((undefined1  [212])((undefined1  [212])p->pCuts[lVar8] & (undefined1  [212])0x3f) !=
          (undefined1  [212])0x0) {
        uVar11 = 0;
        do {
          iVar2 = piVar10[uVar11];
          if (((long)iVar2 < 0) || (pVVar4 = p->pNtk->vObjs, pVVar4->nSize <= iVar2))
          goto LAB_0046f710;
          pvVar6 = pVVar4->pArray[iVar2];
          if ((*(uint *)((long)pvVar6 + 0x14) & 0x40) == 0) {
            *(uint *)((long)pvVar6 + 0x14) = *(uint *)((long)pvVar6 + 0x14) | 0x40;
            iVar2 = *(int *)((long)pvVar6 + 0x10);
            uVar7 = *puVar3;
            if (puVar3[1] == uVar7) {
              if ((int)uVar7 < 0x10) {
                if (*(void **)(puVar3 + 2) == (void *)0x0) {
                  pvVar5 = malloc(0x80);
                }
                else {
                  pvVar5 = realloc(*(void **)(puVar3 + 2),0x80);
                }
                *(void **)(puVar3 + 2) = pvVar5;
                uVar9 = 0x10;
              }
              else {
                uVar9 = uVar7 * 2;
                if ((int)uVar9 <= (int)uVar7) goto LAB_0046f5fa;
                if (*(void **)(puVar3 + 2) == (void *)0x0) {
                  pvVar5 = malloc((ulong)uVar7 << 4);
                }
                else {
                  pvVar5 = realloc(*(void **)(puVar3 + 2),(ulong)uVar7 << 4);
                }
                *(void **)(puVar3 + 2) = pvVar5;
              }
              *puVar3 = uVar9;
            }
LAB_0046f5fa:
            uVar7 = puVar3[1];
            uVar9 = uVar7 + 1;
            puVar3[1] = uVar9;
            *(long *)(*(long *)(puVar3 + 2) + (long)(int)uVar7 * 8) = (long)iVar2;
            iVar2 = *(int *)((long)pvVar6 + 0x2c);
            uVar7 = *puVar3;
            if (uVar9 == uVar7) {
              if ((int)uVar7 < 0x10) {
                if (*(void **)(puVar3 + 2) == (void *)0x0) {
                  pvVar6 = malloc(0x80);
                }
                else {
                  pvVar6 = realloc(*(void **)(puVar3 + 2),0x80);
                }
                uVar9 = 0x10;
              }
              else {
                uVar9 = uVar7 * 2;
                if ((int)uVar9 <= (int)uVar7) goto LAB_0046f677;
                if (*(void **)(puVar3 + 2) == (void *)0x0) {
                  pvVar6 = malloc((ulong)uVar7 << 4);
                }
                else {
                  pvVar6 = realloc(*(void **)(puVar3 + 2),(ulong)uVar7 << 4);
                }
              }
              *(void **)(puVar3 + 2) = pvVar6;
              *puVar3 = uVar9;
            }
LAB_0046f677:
            uVar7 = puVar3[1];
            puVar3[1] = uVar7 + 1;
            *(long *)(*(long *)(puVar3 + 2) + (long)(int)uVar7 * 8) = (long)iVar2;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (*(uint *)(p->pCuts + lVar8) & 0x3f));
      }
      lVar8 = lVar8 + 1;
      piVar10 = piVar10 + 0x35;
    } while (lVar8 < p->nCuts);
  }
  if (0 < (int)puVar3[1]) {
    lVar8 = 0;
    do {
      uVar7 = (uint)*(undefined8 *)(*(long *)(puVar3 + 2) + lVar8 * 8);
      if (((int)uVar7 < 0) || (pVVar4 = p->pNtk->vObjs, pVVar4->nSize <= (int)uVar7)) {
LAB_0046f710:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (uint *)((long)pVVar4->pArray[uVar7 & 0x7fffffff] + 0x14);
      *puVar1 = *puVar1 & 0xffffffbf;
      lVar8 = lVar8 + 2;
    } while ((int)lVar8 < (int)puVar3[1]);
  }
  return;
}

Assistant:

void Lpk_NodeRecordImpact( Lpk_Man_t * p )
{
    Lpk_Cut_t * pCut;
    Vec_Ptr_t * vNodes = Vec_VecEntry( p->vVisited, p->pObj->Id );
    Abc_Obj_t * pNode;
    int i, k;
    // collect the nodes that impact the given node
    Vec_PtrClear( vNodes );
    for ( i = 0; i < p->nCuts; i++ )
    {
        pCut = p->pCuts + i;
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
        {
            pNode = Abc_NtkObj( p->pNtk, pCut->pLeaves[k] );
            if ( pNode->fMarkC )
                continue;
            pNode->fMarkC = 1;
            Vec_PtrPush( vNodes, (void *)(ABC_PTRUINT_T)pNode->Id );
            Vec_PtrPush( vNodes, (void *)(ABC_PTRUINT_T)Abc_ObjFanoutNum(pNode) );
        }
    }
    // clear the marks
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pNode = Abc_NtkObj( p->pNtk, (int)(ABC_PTRUINT_T)pNode );
        pNode->fMarkC = 0;
        i++;
    }
//printf( "%d ", Vec_PtrSize(vNodes) );
}